

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGen::RccLister::list
          (RccLister *this,string *qrcFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *error,bool verbose)

{
  string *this_00;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  streambuf *psVar4;
  int *retVal_00;
  undefined1 auVar5 [16];
  string_view text;
  string_view text_00;
  string_view text_01;
  string local_680;
  reference local_660;
  string *entry;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_630;
  string local_610;
  string local_5f0 [32];
  ostringstream local_5d0 [8];
  ostringstream osst;
  long local_458;
  ifstream ifs;
  undefined1 local_250 [8];
  string qrcContents;
  string local_228;
  char local_201;
  string local_200;
  char local_1d9;
  undefined1 local_1d8 [16];
  string local_1c8;
  string local_1a8;
  rep local_188;
  char local_179;
  string local_178;
  string local_158;
  string local_138;
  undefined1 local_118 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string rccStdErr;
  string rccStdOut;
  int retVal;
  bool result;
  string fileDir;
  string local_78;
  string local_58;
  byte local_31;
  string *psStack_30;
  bool verbose_local;
  string *error_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *qrcFile_local;
  RccLister *this_local;
  
  local_31 = verbose;
  psStack_30 = error;
  error_local = (string *)files;
  files_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)qrcFile;
  qrcFile_local = &this->RccExcutable_;
  std::__cxx11::string::clear();
  bVar1 = cmsys::SystemTools::FileExists((string *)files_local,true);
  if (bVar1) {
    cmsys::SystemTools::GetFilenamePath((string *)&retVal,(string *)files_local);
    uVar2 = std::__cxx11::string::empty();
    if ((((uVar2 & 1) != 0) ||
        (bVar1 = cmsys::SystemTools::FileExists(&this->RccExcutable_,true), !bVar1)) ||
       (bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->ListOptions_), bVar1)) {
      std::__cxx11::string::string((string *)local_250);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_458,pcVar3,_S_in);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_458 + *(long *)(local_458 + -0x18)));
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_5d0);
        psVar4 = (streambuf *)std::ifstream::rdbuf();
        std::ostream::operator<<(local_5d0,psVar4);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)local_250,local_5f0);
        std::__cxx11::string::~string(local_5f0);
        std::__cxx11::ostringstream::~ostringstream(local_5d0);
      }
      else {
        auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)files_local);
        text_01._M_len = auVar5._8_8_;
        text_01._M_str = (char *)error;
        Quoted_abi_cxx11_(&local_630,auVar5._0_8_,text_01);
        cmStrCat<char_const(&)[19],std::__cxx11::string,char_const(&)[18]>
                  (&local_610,(char (*) [19])"The resource file ",&local_630,
                   (char (*) [18])" is not readable\n");
        std::__cxx11::string::operator=((string *)psStack_30,(string *)&local_610);
        std::__cxx11::string::~string((string *)&local_610);
        std::__cxx11::string::~string((string *)&local_630);
        this_local._7_1_ = 0;
      }
      qrcContents.field_2._9_3_ = 0;
      qrcContents.field_2._M_local_buf[8] = !bVar1;
      std::ifstream::~ifstream(&local_458);
      if (qrcContents.field_2._8_4_ == 0) {
        RccListParseContent((string *)local_250,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)error_local);
        qrcContents.field_2._8_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_250);
      this_00 = error_local;
    }
    else {
      rccStdOut.field_2._M_local_buf[0xf] = '\0';
      rccStdOut.field_2._8_4_ = 0;
      std::__cxx11::string::string((string *)(rccStdErr.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)
                 &cmd.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_118);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_118,
                 &this->RccExcutable_);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_118,&this->ListOptions_);
      cmsys::SystemTools::GetFilenameName(&local_138,(string *)files_local);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_118,
                 &local_138);
      std::__cxx11::string::~string((string *)&local_138);
      if ((local_31 & 1) != 0) {
        QuotedCommand(&local_178,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_118);
        local_179 = '\n';
        cmStrCat<char_const(&)[18],std::__cxx11::string,char>
                  (&local_158,(char (*) [18])"Running command:\n",&local_178,&local_179);
        cmSystemTools::Stdout(&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
      }
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_188 = (rep)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      retVal_00 = (int *)(rccStdOut.field_2._M_local_buf + 8);
      rccStdOut.field_2._M_local_buf[0xf] =
           cmSystemTools::RunSingleCommand
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_118,(string *)((long)&rccStdErr.field_2 + 8),
                      (string *)
                      &cmd.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,retVal_00,pcVar3,
                      OUTPUT_NONE,(cmDuration)local_188,Auto);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118);
      if (((rccStdOut.field_2._M_local_buf[0xf] & 1U) == 0) || (rccStdOut.field_2._8_4_ != 0)) {
        local_1d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)files_local);
        text_00._M_len = local_1d8._8_8_;
        text_00._M_str = (char *)retVal_00;
        Quoted_abi_cxx11_(&local_1c8,local_1d8._0_8_,text_00);
        local_1d9 = '\n';
        cmStrCat<char_const(&)[33],std::__cxx11::string,char>
                  (&local_1a8,(char (*) [33])"The rcc list process failed for ",&local_1c8,
                   &local_1d9);
        std::__cxx11::string::operator=((string *)psStack_30,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          local_201 = '\n';
          cmStrCat<std::__cxx11::string&,char>
                    (&local_200,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&rccStdErr.field_2 + 8),&local_201);
          std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_200);
          std::__cxx11::string::~string((string *)&local_200);
        }
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          qrcContents.field_2._M_local_buf[0xf] = '\n';
          cmStrCat<std::__cxx11::string&,char>
                    (&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmd.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     qrcContents.field_2._M_local_buf + 0xf);
          std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_228);
          std::__cxx11::string::~string((string *)&local_228);
        }
        this_local._7_1_ = 0;
        qrcContents.field_2._8_4_ = 1;
      }
      else {
        bVar1 = RccListParseOutput((string *)((long)&rccStdErr.field_2 + 8),
                                   (string *)
                                   &cmd.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)error_local,psStack_30);
        auVar5._8_8_ = local_1d8._8_8_;
        auVar5._0_8_ = local_1d8._0_8_;
        if (bVar1) {
          qrcContents.field_2._8_4_ = 0;
        }
        else {
          this_local._7_1_ = 0;
          qrcContents.field_2._8_4_ = 1;
          local_1d8 = auVar5;
        }
      }
      std::__cxx11::string::~string
                ((string *)
                 &cmd.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(rccStdErr.field_2._M_local_buf + 8));
      this_00 = error_local;
    }
    error_local = this_00;
    if (qrcContents.field_2._8_4_ == 0) {
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_00);
      entry = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&entry);
        if (!bVar1) break;
        local_660 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
        cmsys::SystemTools::CollapseFullPath(&local_680,local_660,(string *)&retVal);
        std::__cxx11::string::operator=((string *)local_660,(string *)&local_680);
        std::__cxx11::string::~string((string *)&local_680);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = 1;
      qrcContents.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&retVal);
  }
  else {
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)files_local);
    text._M_len = auVar5._8_8_;
    text._M_str = (char *)error;
    Quoted_abi_cxx11_(&local_78,auVar5._0_8_,text);
    cmStrCat<char_const(&)[19],std::__cxx11::string,char_const(&)[17]>
              (&local_58,(char (*) [19])"The resource file ",&local_78,(char (*) [17])0x1057a8a);
    std::__cxx11::string::operator=((string *)psStack_30,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGen::RccLister::list(std::string const& qrcFile,
                                  std::vector<std::string>& files,
                                  std::string& error, bool verbose) const
{
  error.clear();

  if (!cmSystemTools::FileExists(qrcFile, true)) {
    error =
      cmStrCat("The resource file ", Quoted(qrcFile), " does not exist.");
    return false;
  }

  // Run rcc list command in the directory of the qrc file with the pathless
  // qrc file name argument.  This way rcc prints relative paths.
  // This avoids issues on Windows when the qrc file is in a path that
  // contains non-ASCII characters.
  std::string const fileDir = cmSystemTools::GetFilenamePath(qrcFile);

  if (!this->RccExcutable_.empty() &&
      cmSystemTools::FileExists(this->RccExcutable_, true) &&
      !this->ListOptions_.empty()) {

    bool result = false;
    int retVal = 0;
    std::string rccStdOut;
    std::string rccStdErr;
    {
      std::vector<std::string> cmd;
      cmd.emplace_back(this->RccExcutable_);
      cm::append(cmd, this->ListOptions_);
      cmd.emplace_back(cmSystemTools::GetFilenameName(qrcFile));

      // Log command
      if (verbose) {
        cmSystemTools::Stdout(
          cmStrCat("Running command:\n", QuotedCommand(cmd), '\n'));
      }

      result = cmSystemTools::RunSingleCommand(
        cmd, &rccStdOut, &rccStdErr, &retVal, fileDir.c_str(),
        cmSystemTools::OUTPUT_NONE, cmDuration::zero(), cmProcessOutput::Auto);
    }
    if (!result || retVal) {
      error =
        cmStrCat("The rcc list process failed for ", Quoted(qrcFile), '\n');
      if (!rccStdOut.empty()) {
        error += cmStrCat(rccStdOut, '\n');
      }
      if (!rccStdErr.empty()) {
        error += cmStrCat(rccStdErr, '\n');
      }
      return false;
    }
    if (!RccListParseOutput(rccStdOut, rccStdErr, files, error)) {
      return false;
    }
  } else {
    // We can't use rcc for the file listing.
    // Read the qrc file content into string and parse it.
    {
      std::string qrcContents;
      {
        cmsys::ifstream ifs(qrcFile.c_str());
        if (ifs) {
          std::ostringstream osst;
          osst << ifs.rdbuf();
          qrcContents = osst.str();
        } else {
          error = cmStrCat("The resource file ", Quoted(qrcFile),
                           " is not readable\n");
          return false;
        }
      }
      // Parse string content
      RccListParseContent(qrcContents, files);
    }
  }

  // Convert relative paths to absolute paths
  for (std::string& entry : files) {
    entry = cmSystemTools::CollapseFullPath(entry, fileDir);
  }
  return true;
}